

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dsk.c
# Opt level: O1

LispPTR DSK_directorynamep(LispPTR *args)

{
  byte bVar1;
  ushort uVar2;
  uint uVar3;
  uint uVar4;
  int iVar5;
  int iVar6;
  long lVar7;
  size_t sVar8;
  ulong uVar9;
  DLword *pDVar10;
  char *pcVar11;
  char *pcVar12;
  long lVar13;
  char dirname [4096];
  char fullname [4096];
  char local_2028 [4096];
  char local_1028 [4096];
  
  pcVar11 = local_2028;
  iVar5 = _setjmp((__jmp_buf_tag *)jmpbuf);
  if (iVar5 == 0) {
    uVar3 = args[2];
    if ((uVar3 & 1) != 0) {
      printf("Misaligned pointer in NativeAligned4FromLAddr 0x%x\n",(ulong)uVar3);
    }
    Lisp_errno = (int *)(Lisp_world + uVar3);
    uVar3 = *args;
    if ((uVar3 & 1) != 0) {
      printf("Misaligned pointer in NativeAligned4FromLAddr 0x%x\n",(ulong)uVar3);
    }
    bVar1 = (byte)Lisp_world[(ulong)uVar3 + 3];
    uVar9 = (ulong)bVar1;
    if (bVar1 == 0x44) {
      uVar9 = (long)*(int *)(Lisp_world + (ulong)uVar3 + 4) * 2;
      lVar7 = 5;
    }
    else if (bVar1 == 0x43) {
      uVar9 = (ulong)*(int *)(Lisp_world + (ulong)uVar3 + 4);
      lVar7 = 3;
    }
    else {
      error("LispStringLength: Not a character array.\n");
      lVar7 = 5;
    }
    if (lVar7 + uVar9 < 0xfff) {
      uVar3 = *args;
      if ((uVar3 & 1) != 0) {
        printf("Misaligned pointer in NativeAligned4FromLAddr 0x%x\n",(ulong)uVar3);
      }
      iVar5 = *(int *)(Lisp_world + (ulong)uVar3 + 4);
      iVar6 = 0x1000;
      if (iVar5 < 0x1000) {
        iVar6 = iVar5;
      }
      lVar7 = (long)iVar6;
      if ((char)Lisp_world[(ulong)uVar3 + 3] == 'D') {
        pcVar12 = local_2028;
        if (iVar5 != 0) {
          lVar7 = lVar7 + (ulong)(lVar7 == 0);
          pDVar10 = Lisp_world +
                    (ulong)Lisp_world[(ulong)uVar3 + 2] +
                    (ulong)(*(uint *)(Lisp_world + uVar3) & 0xfffffff);
          do {
            *pcVar11 = *(undefined1 *)((ulong)pDVar10 ^ 2);
            pcVar11 = pcVar11 + 1;
            pDVar10 = pDVar10 + 1;
            lVar7 = lVar7 + -1;
            pcVar12 = pcVar11;
          } while (lVar7 != 0);
        }
        *pcVar12 = 0;
      }
      else if ((char)Lisp_world[(ulong)uVar3 + 3] == 'C') {
        if (iVar5 != 0) {
          uVar4 = *(uint *)(Lisp_world + uVar3);
          uVar2 = Lisp_world[(ulong)uVar3 + 2];
          lVar13 = 0;
          do {
            local_2028[lVar13] =
                 *(char *)((long)Lisp_world + lVar13 + (ulong)uVar2 + (ulong)(uVar4 & 0xfffffff) * 2
                          ^ 3);
            lVar13 = lVar13 + 1;
          } while (lVar7 + (ulong)(lVar7 == 0) != lVar13);
        }
        local_2028[lVar7] = '\0';
      }
      else {
        error("LispStringToCString: Not a character array.\n");
      }
      iVar5 = unixpathname(local_2028,local_1028,1,0);
      if (iVar5 == 0) {
        return 0;
      }
      iVar5 = true_name(local_1028);
      if (iVar5 != -1) {
        return 0;
      }
      iVar5 = lisppathname(local_1028,local_2028,1,0);
      if (iVar5 == 0) {
        return 0;
      }
      sVar8 = strlen(local_2028);
      uVar3 = args[1];
      if ((uVar3 & 1) != 0) {
        printf("Misaligned pointer in NativeAligned4FromLAddr 0x%x\n",(ulong)uVar3);
      }
      pDVar10 = Lisp_world;
      if (sVar8 != 0xffffffffffffffff) {
        uVar3 = *(uint *)(Lisp_world + uVar3);
        lVar7 = 0;
        do {
          *(char *)((long)pDVar10 + lVar7 + (ulong)(uVar3 & 0xfffffff) * 2 ^ 3) = local_2028[lVar7];
          lVar7 = lVar7 + 1;
        } while (sVar8 + 1 != lVar7);
      }
      if (sVar8 < 0x10000) {
        return (uint)sVar8 | 0xe0000;
      }
      error("Not Smallp data");
      return 0xe0000;
    }
    *Lisp_errno = 200;
  }
  else {
    *Lisp_errno = 100;
  }
  return 0;
}

Assistant:

LispPTR DSK_directorynamep(LispPTR *args)
{
  char dirname[MAXPATHLEN];
  char fullname[MAXPATHLEN];
  size_t len;
  int fatp;
  char *base;
#ifdef DOS
  char drive[1], rawname[MAXNAMLEN];
  int extlen; /* len of extension, for making backup filename */
#endif        /* DOS */

  ERRSETJMP(NIL);
  Lisp_errno = (int *)NativeAligned4FromLAddr(args[2]);

  LispStringLength(args[0], len, fatp);
  /*
   * Because of the version number convention, Lisp pathname might
   * be shorter than UNIX one.  For THIN string, the difference
   * is 2 bytes, for FAT string, 4 bytes.  Add 1 byte for NULL
   * terminating character.
   */
  len = fatp ? len + 4 + 1 : len + 2 + 1;
  /* -2 for the initial and trail directory delimiter. */
  if (len > MAXPATHLEN - 2) FileNameTooLong(NIL);

  LispStringToCString(args[0], dirname, MAXPATHLEN);

/* Convert Xerox Lisp file naming convention to Unix one. */
#ifdef DOS
  separate_drive(dirname, drive);
  if (unixpathname(dirname, fullname, 1, 0, drive, 0, 0) == 0) return (NIL);
#else  /* DOS*/
  if (unixpathname(dirname, fullname, 1, 0) == 0) return (NIL);
#endif /* DOS */

  if (true_name(fullname) != -1) return (NIL);

  /* Convert Unix file naming convention to Xerox Lisp one. */
  if (lisppathname(fullname, dirname, 1, 0) == 0) return (NIL);

  len = strlen(dirname);
  STRING_BASE(args[1], base);

#ifndef BYTESWAP
  strncpy(base, dirname, len + 1);
#else
  StrNCpyFromCToLisp(base, dirname, len + 1);
#endif /* BYTESWAP */

  return (GetPosSmallp(len));
}